

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockBuilderVisitor.cpp
# Opt level: O3

void __thiscall
IRT::BlockBuilderVisitor::Visit
          (BlockBuilderVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  pointer pcVar1;
  Statement *root;
  ConditionalBlock *this_00;
  mapped_type *ppBVar2;
  Label local_b0;
  string local_90;
  Label local_70;
  Label local_50;
  
  this_00 = (ConditionalBlock *)operator_new(0x80);
  local_b0.label_._M_dataplus._M_p = (pointer)&local_b0.label_.field_2;
  pcVar1 = (this->current_label_).label_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (this->current_label_).label_._M_string_length);
  root = this->current_root_;
  local_50.label_._M_dataplus._M_p = (pointer)&local_50.label_.field_2;
  pcVar1 = (jump_conditional_statement->label_true_).label_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,
             pcVar1 + (jump_conditional_statement->label_true_).label_._M_string_length);
  local_70.label_._M_dataplus._M_p = (pointer)&local_70.label_.field_2;
  pcVar1 = (jump_conditional_statement->label_false_).label_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,
             pcVar1 + (jump_conditional_statement->label_false_).label_._M_string_length);
  ConditionalBlock::ConditionalBlock(this_00,&local_b0,root,&local_50,&local_70);
  Label::ToString_abi_cxx11_(&local_90,&this->current_label_);
  ppBVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
            ::operator[](&this->blocks_,&local_90);
  *ppBVar2 = (mapped_type)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label_._M_dataplus._M_p != &local_70.label_.field_2) {
    operator_delete(local_70.label_._M_dataplus._M_p,
                    local_70.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label_._M_dataplus._M_p != &local_50.label_.field_2) {
    operator_delete(local_50.label_._M_dataplus._M_p,
                    local_50.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.label_._M_dataplus._M_p != &local_b0.label_.field_2) {
    operator_delete(local_b0.label_._M_dataplus._M_p,
                    local_b0.label_.field_2._M_allocated_capacity + 1);
  }
  if (this->root_block_ == (Block *)0x0) {
    Label::ToString_abi_cxx11_(&local_90,&this->current_label_);
    ppBVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
              ::operator[](&this->blocks_,&local_90);
    this->root_block_ = *ppBVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  (*(jump_conditional_statement->left_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->left_operand_,this);
  (*(jump_conditional_statement->right_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->right_operand_,this);
  return;
}

Assistant:

void BlockBuilderVisitor::Visit(
    JumpConditionalStatement *jump_conditional_statement) {
  blocks_[current_label_.ToString()] = new ConditionalBlock(
      current_label_, current_root_, jump_conditional_statement->label_true_,
      jump_conditional_statement->label_false_);

  if (root_block_ == nullptr) {
    root_block_ = blocks_[current_label_.ToString()];
  }

  jump_conditional_statement->left_operand_->Accept(this);
  jump_conditional_statement->right_operand_->Accept(this);
}